

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O2

void __thiscall indk::NeuralNet::doParseLinks(NeuralNet *this,EntryList *entries,string *id)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  *p_Var2;
  pointer ptVar3;
  pointer ptVar4;
  long lVar5;
  bool bVar6;
  _Base_ptr p_Var7;
  __type _Var8;
  _Rb_tree_color _Var9;
  iterator iVar10;
  undefined7 extraout_var;
  iterator iVar11;
  ulong uVar12;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  *p_Var13;
  NeuralNet *pNVar14;
  _Rb_tree_color _Var15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *en;
  pointer pbVar16;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *e;
  pointer __args;
  pointer pbVar17;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>_>
  __i;
  pointer ptVar18;
  int shift;
  pointer local_1b8;
  NeuralNet *local_1b0;
  _Base_ptr local_1a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
  *local_1a0;
  string *local_198;
  string *local_190;
  LinkList *__range3;
  _Base_ptr local_180;
  void *local_178;
  __tuple_element_t<3UL,_tuple<basic_string<char>,_basic_string<char>,_void_*,_long>_> latency;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_void_*,_long>_> from;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nlinks;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  value_type i;
  NQueue nqueue;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_void_*,_long>_> to;
  
  local_198 = (string *)&this->PrepareID;
  local_190 = id;
  _Var8 = std::operator==(id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_198);
  if (!_Var8) {
    __range3 = &this->Links;
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
    ::clear(__range3);
    std::
    queue<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::deque<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>>>>
    ::
    queue<std::deque<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>>>,void>
              ((queue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::deque<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>_>
                *)&nqueue);
    local_1b8 = (entries->
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    local_1b0 = this;
    for (__args = (entries->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; __args != local_1b8;
        __args = __args + 1) {
      pbVar17 = (__args->second).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar16 = (__args->second).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar17;
          pbVar16 = pbVar16 + 1) {
        nlinks.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        i.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
        .
        super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
        .super__Tuple_impl<2UL,_void_*,_long>.super__Tuple_impl<3UL,_long>.
        super__Head_base<3UL,_long,_false>._M_head_impl._0_4_ = 0;
        std::
        deque<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>>>
        ::
        emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,decltype(nullptr),int>
                  ((deque<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>>>
                    *)&nqueue,&__args->first,pbVar16,(void **)&nlinks,(int *)&i);
      }
    }
    local_1a0 = &local_1b0->Neurons;
    local_1a8 = &(local_1b0->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_00 = &local_1b0->Latencies;
    p_Var1 = &(local_1b0->Latencies)._M_t._M_impl.super__Rb_tree_header;
    pNVar14 = local_1b0;
    while (nqueue.c.
           super__Deque_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           nqueue.c.
           super__Deque_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
      ::_Tuple_impl(&i.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                    ,&(nqueue.c.
                       super__Deque_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                   );
      std::
      deque<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
      ::pop_front(&nqueue.c);
      std::__cxx11::string::string
                ((string *)&from,
                 (string *)
                 &i.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                );
      std::__cxx11::string::string
                ((string *)&to,
                 (string *)
                 &i.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                  .
                  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                  .
                  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                );
      latency = CONCAT44(i.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                         .
                         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                         .super__Tuple_impl<2UL,_void_*,_long>.super__Tuple_impl<3UL,_long>.
                         super__Head_base<3UL,_long,_false>._M_head_impl._4_4_,
                         (undefined4)
                         i.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                         .
                         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                         .super__Tuple_impl<2UL,_void_*,_long>.super__Tuple_impl<3UL,_long>.
                         super__Head_base<3UL,_long,_false>._M_head_impl);
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
               ::find(&local_1a0->_M_t,&to);
      if (iVar10._M_node != local_1a8) {
        p_Var13 = &((pNVar14->Links).
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
        ;
        p_Var2 = &((pNVar14->Links).
                   super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
        ;
        local_1b8 = (pointer)((ulong)local_1b8 & 0xffffffff00000000);
        local_180 = iVar10._M_node;
        do {
          if (p_Var13 == p_Var2) break;
          std::
          _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
          ::_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                         *)&nlinks,p_Var13);
          _Var8 = std::operator==(&from,&local_110);
          if (_Var8) {
            _Var8 = std::operator==(&to,&local_130);
            if (!_Var8) goto LAB_0010f40b;
            local_1b8 = (pointer)CONCAT44(local_1b8._4_4_,(int)CONCAT71(extraout_var,1));
            bVar6 = false;
          }
          else {
LAB_0010f40b:
            bVar6 = true;
          }
          std::
          _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
          ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                          *)&nlinks);
          p_Var13 = p_Var13 + 1;
        } while (bVar6);
        p_Var7 = local_180;
        pNVar14 = local_1b0;
        if (((ulong)local_1b8 & 1) == 0) {
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                   ::find(&local_1a0->_M_t,&from);
          if (iVar10._M_node != local_1a8) {
            std::
            vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>
            ::
            emplace_back<std::__cxx11::string&,std::__cxx11::string&,indk::Neuron*&,indk::Neuron*&,long&>
                      ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>
                        *)__range3,&from,&to,(Neuron **)(iVar10._M_node + 2),(Neuron **)(p_Var7 + 2)
                       ,&latency);
          }
          Neuron::getLinkOutput_abi_cxx11_(&nlinks,*(Neuron **)(p_Var7 + 2));
          pbVar16 = nlinks.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar17 = nlinks.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar17 != pbVar16;
              pbVar17 = pbVar17 + 1) {
            shift = 0;
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find(&this_00->_M_t,pbVar17);
            if ((_Rb_tree_header *)iVar11._M_node == p_Var1) {
              _Var15 = _S_red;
            }
            else {
              _Var15 = iVar11._M_node[2]._M_color;
            }
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find(&this_00->_M_t,&to);
            if ((_Rb_tree_header *)iVar11._M_node == p_Var1) {
              _Var9 = _S_red;
            }
            else {
              _Var9 = iVar11._M_node[2]._M_color;
            }
            shift = _Var15 - _Var9;
            local_178 = (void *)0x0;
            std::
            deque<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>>>
            ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,decltype(nullptr),int&>
                      ((deque<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,long>>>
                        *)&nqueue,&to,pbVar17,&local_178,&shift);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&nlinks);
          pNVar14 = local_1b0;
        }
      }
      std::__cxx11::string::~string((string *)&to);
      std::__cxx11::string::~string((string *)&from);
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
      ::~_Tuple_impl(&i.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>
                    );
    }
    ptVar3 = (pNVar14->Links).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptVar4 = (pNVar14->Links).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ptVar3 != ptVar4) {
      uVar12 = ((long)ptVar4 - (long)ptVar3) / 0x58;
      lVar5 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<indk::NeuralNet::doParseLinks(std::vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,std::__cxx11::string_const&)::__0>>
                (ptVar3,ptVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ptVar4 - (long)ptVar3 < 0x581) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<indk::NeuralNet::doParseLinks(std::vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,std::__cxx11::string_const&)::__0>>
                  (ptVar3,ptVar4);
      }
      else {
        ptVar18 = ptVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<indk::NeuralNet::doParseLinks(std::vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,std::__cxx11::string_const&)::__0>>
                  (ptVar3,ptVar18);
        for (; ptVar18 != ptVar4; ptVar18 = ptVar18 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,void*,void*,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<indk::NeuralNet::doParseLinks(std::vector<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>const&,std::__cxx11::string_const&)::__0>>
                    (ptVar18);
        }
      }
    }
    std::__cxx11::string::_M_assign(local_198);
    std::
    deque<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_long>_>_>
    ::~deque(&nqueue.c);
  }
  return;
}

Assistant:

void indk::NeuralNet::doParseLinks(const EntryList& entries, const std::string& id) {
    if (id == PrepareID) return;

    Links.clear();

    NQueue nqueue;

    for (auto &e: entries) {
        for (auto &en: e.second) {
            nqueue.emplace(e.first, en, nullptr, 0);
        }
    }

    while (!nqueue.empty()) {
        auto i = nqueue.front();
        nqueue.pop();

        auto from = std::get<0>(i);
        auto to = std::get<1>(i);
        auto latency = std::get<3>(i);

        auto n = Neurons.find(to);

        if (n != Neurons.end()) {
            bool skip = false;
            for (auto l: Links) {
                if (from == std::get<0>(l) && to == std::get<1>(l)) {
                    skip = true;
                    break;
                }
            }
            if (skip) continue;
            auto nprev = Neurons.find(from);
            auto type = 0;
            if (nprev != Neurons.end()) Links.emplace_back(from, to, nprev->second, n->second, latency);

            auto nlinks = n -> second -> getLinkOutput();
            for (auto &nl: nlinks) {
                auto shift = 0;
                auto nlatency = 0;
                auto lnext = Latencies.find(nl);
                if (lnext != Latencies.end()) nlatency = lnext -> second;
                auto lto = Latencies.find(to);
                auto latencyto = lto != Latencies.end() ? lto->second : 0;
                shift = nlatency-latencyto;
                nqueue.emplace(to, nl, nullptr, shift);
            }
        }
    }

    std::sort(Links.begin(), Links.end(), [] (const indk::LinkDefinition& l1, const indk::LinkDefinition& l2) {
        if (std::get<4>(l1) < std::get<4>(l2)) return true;
        return false;
    });

//    std::cout << std::endl;
//    for (auto l: Links) {
//        std::cerr << std::get<0>(l) << " -> " << std::get<1>(l) << " " << std::get<4>(l) << std::endl;
//    }

    PrepareID = id;
}